

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineStatisticsQueryTestFunctionalBase::initQOBO
          (PipelineStatisticsQueryTestFunctionalBase *this)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  uchar bo_data [32];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  pcVar1 = *(code **)(lVar6 + 0x40);
  pcVar2 = *(code **)(lVar6 + 0x150);
  pcVar3 = *(code **)(lVar6 + 0x800);
  bo_data[0x10] = 0xff;
  bo_data[0x11] = 0xff;
  bo_data[0x12] = 0xff;
  bo_data[0x13] = 0xff;
  bo_data[0x14] = 0xff;
  bo_data[0x15] = 0xff;
  bo_data[0x16] = 0xff;
  bo_data[0x17] = 0xff;
  bo_data[0x18] = 0xff;
  bo_data[0x19] = 0xff;
  bo_data[0x1a] = 0xff;
  bo_data[0x1b] = 0xff;
  bo_data[0x1c] = 0xff;
  bo_data[0x1d] = 0xff;
  bo_data[0x1e] = 0xff;
  bo_data[0x1f] = 0xff;
  bo_data[0] = 0xff;
  bo_data[1] = 0xff;
  bo_data[2] = 0xff;
  bo_data[3] = 0xff;
  bo_data[4] = 0xff;
  bo_data[5] = 0xff;
  bo_data[6] = 0xff;
  bo_data[7] = 0xff;
  bo_data[8] = 0xff;
  bo_data[9] = 0xff;
  bo_data[10] = 0xff;
  bo_data[0xb] = 0xff;
  bo_data[0xc] = 0xff;
  bo_data[0xd] = 0xff;
  bo_data[0xe] = 0xff;
  bo_data[0xf] = 0xff;
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_bo_qo_id);
  dVar5 = (*pcVar3)();
  glu::checkError(dVar5,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x89e);
  (*pcVar1)(0x8892,this->m_bo_qo_id);
  dVar5 = (*pcVar3)();
  glu::checkError(dVar5,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x8a1);
  (*pcVar2)(0x8892,0x20,bo_data,0x88e4);
  dVar5 = (*pcVar3)();
  glu::checkError(dVar5,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x8a4);
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctionalBase::initQOBO()
{
	const glw::Functions gl = m_context.getRenderContext().getFunctions();

	/* Set up the buffer object we will use for storage of query object results */
	unsigned char bo_data[PipelineStatisticsQueryUtilities::qo_bo_size];

	memset(bo_data, 0xFF, sizeof(bo_data));

	gl.genBuffers(1, &m_bo_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, PipelineStatisticsQueryUtilities::qo_bo_size, bo_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");
}